

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9MLGen(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  int nArgcNew;
  char **pArgvNew;
  char *pFileName;
  int fVerbose;
  int fBinData;
  int nWords;
  int Seed;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fBinData = 0;
  fVerbose = 10;
  bVar1 = false;
  bVar2 = false;
  pArgvNew = (char **)0x0;
  Extra_UtilGetoptReset();
LAB_002a215e:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"WSbvh");
    if (iVar3 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9MLGen(): There is no AIG.\n");
        return 1;
      }
      iVar3 = Gia_ManRegNum(pAbc->pGia);
      if (iVar3 < 1) {
        Vec_WrdFreeP(&pAbc->pGia->vSimsPi);
        if (argc == globalUtilOptind) {
          printf("Default file names will be used.\n");
        }
        else {
          pArgvNew = (char **)argv[globalUtilOptind];
          if (argc - globalUtilOptind != 1) {
            Abc_Print(-1,"File name is not given on the command line.\n");
            return 1;
          }
        }
        if (bVar1) {
          Gia_ManDumpFiles(pAbc->pGia,fVerbose,fVerbose,fBinData,(char *)pArgvNew);
        }
        else {
          Gia_ManDumpPlaFiles(pAbc->pGia,fVerbose,fVerbose,fBinData,(char *)pArgvNew);
        }
        return 0;
      }
      Abc_Print(-1,"Abc_CommandAbc9MLGen(): This command works only for combinational AIGs.\n");
      return 0;
    }
    switch(iVar3) {
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_002a23cc;
      }
      fBinData = atoi(argv[globalUtilOptind]);
      iVar3 = fBinData;
      break;
    default:
      goto LAB_002a23cc;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_002a23cc;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      iVar3 = fVerbose;
      break;
    case 0x62:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002a215e;
    case 0x68:
      goto LAB_002a23cc;
    case 0x76:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_002a215e;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar3 < 0) {
LAB_002a23cc:
      Abc_Print(-2,"usage: &mlgen [-WS num] [-bvh] <file>\n");
      Abc_Print(-2,"\t         generates data files for machine learning\n");
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
                (ulong)(uint)fVerbose);
      Abc_Print(-2,"\t-S num : the random seed for simulation data (num < 10000) [default = %d]\n",
                (ulong)(uint)fBinData);
      pcVar4 = "no";
      if (bVar1) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggle using binary data files [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (bVar2) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : file to store the simulation info\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9MLGen( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManDumpFiles( Gia_Man_t * p, int nCexesT, int nCexesV, int Seed, char * pFileName );
    extern void Gia_ManDumpPlaFiles( Gia_Man_t * p, int nCexesT, int nCexesV, int Seed, char * pFileName );
    int c, Seed = 0, nWords = 10, fBinData = 0, fVerbose = 0;
    char * pFileName = NULL;
    char ** pArgvNew;
    int nArgcNew;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WSbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            Seed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Seed < 0 )
                goto usage;
            break;
        case 'b':
            fBinData ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MLGen(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9MLGen(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew == 0 )
        printf( "Default file names will be used.\n" );
    else
        pFileName = pArgvNew[0];
    if ( nArgcNew != 0 && nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    if ( fBinData )
        Gia_ManDumpFiles( pAbc->pGia, nWords, nWords, Seed, pFileName );
    else
        Gia_ManDumpPlaFiles( pAbc->pGia, nWords, nWords, Seed, pFileName );
    return 0;

usage:
    Abc_Print( -2, "usage: &mlgen [-WS num] [-bvh] <file>\n" );
    Abc_Print( -2, "\t         generates data files for machine learning\n" );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", nWords );
    Abc_Print( -2, "\t-S num : the random seed for simulation data (num < 10000) [default = %d]\n", Seed );
    Abc_Print( -2, "\t-b     : toggle using binary data files [default = %s]\n", fBinData? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file to store the simulation info\n");
    return 1;
}